

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_compress.c
# Opt level: O0

int compress_bidder_init(archive_read_filter *self)

{
  uint uVar1;
  void *__ptr;
  void *__ptr_00;
  long in_RDI;
  int code;
  void *out_block;
  private_data *state;
  int local_24;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  *(undefined4 *)(in_RDI + 0x60) = 3;
  *(char **)(in_RDI + 0x58) = "compress (.Z)";
  __ptr = calloc(0x3ff80,1);
  __ptr_00 = malloc(0x10000);
  if ((__ptr == (void *)0x0) || (__ptr_00 == (void *)0x0)) {
    free(__ptr_00);
    free(__ptr);
    archive_set_error(*(archive **)(in_RDI + 0x18),0xc,"Can\'t allocate data for %s decompression",
                      *(undefined8 *)(in_RDI + 0x58));
    iVar2 = -0x1e;
  }
  else {
    *(void **)(in_RDI + 0x50) = __ptr;
    *(undefined8 *)((long)__ptr + 0x28) = 0x10000;
    *(void **)((long)__ptr + 0x30) = __ptr_00;
    *(code **)(in_RDI + 0x28) = compress_filter_read;
    *(undefined8 *)(in_RDI + 0x30) = 0;
    *(code **)(in_RDI + 0x40) = compress_filter_close;
    getbits((archive_read_filter *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
            (int)((ulong)in_RDI >> 0x20));
    iVar2 = (int)((ulong)in_RDI >> 0x20);
    getbits((archive_read_filter *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
            iVar2);
    uVar1 = getbits((archive_read_filter *)
                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),iVar2);
    *(uint *)((long)__ptr + 0x44) = uVar1 & 0x1f;
    *(int *)((long)__ptr + 0x40) = 1 << ((byte)*(undefined4 *)((long)__ptr + 0x44) & 0x1f);
    *(uint *)((long)__ptr + 0x38) = uVar1 & 0x80;
    *(undefined4 *)((long)__ptr + 0x58) = 0x100;
    *(long *)((long)__ptr + 0x30060) = (long)__ptr + 0x30068;
    if (*(int *)((long)__ptr + 0x38) != 0) {
      *(int *)((long)__ptr + 0x58) = *(int *)((long)__ptr + 0x58) + 1;
    }
    *(undefined4 *)((long)__ptr + 0x4c) = 9;
    *(int *)((long)__ptr + 0x48) = (1 << ((byte)*(undefined4 *)((long)__ptr + 0x4c) & 0x1f)) + -1;
    *(undefined4 *)((long)__ptr + 0x50) = 0xffffffff;
    for (local_24 = 0xff; -1 < local_24; local_24 = local_24 + -1) {
      *(undefined2 *)((long)__ptr + (long)local_24 * 2 + 0x1005c) = 0;
      *(char *)((long)__ptr + (long)local_24 + 0x5c) = (char)local_24;
    }
    next_code((archive_read_filter *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
compress_bidder_init(struct archive_read_filter *self)
{
	struct private_data *state;
	static const size_t out_block_size = 64 * 1024;
	void *out_block;
	int code;

	self->code = ARCHIVE_FILTER_COMPRESS;
	self->name = "compress (.Z)";

	state = (struct private_data *)calloc(sizeof(*state), 1);
	out_block = malloc(out_block_size);
	if (state == NULL || out_block == NULL) {
		free(out_block);
		free(state);
		archive_set_error(&self->archive->archive, ENOMEM,
		    "Can't allocate data for %s decompression",
		    self->name);
		return (ARCHIVE_FATAL);
	}

	self->data = state;
	state->out_block_size = out_block_size;
	state->out_block = out_block;
	self->read = compress_filter_read;
	self->skip = NULL; /* not supported */
	self->close = compress_filter_close;

	/* XXX MOVE THE FOLLOWING OUT OF INIT() XXX */

	(void)getbits(self, 8); /* Skip first signature byte. */
	(void)getbits(self, 8); /* Skip second signature byte. */

	code = getbits(self, 8);
	state->maxcode_bits = code & 0x1f;
	state->maxcode = (1 << state->maxcode_bits);
	state->use_reset_code = code & 0x80;

	/* Initialize decompressor. */
	state->free_ent = 256;
	state->stackp = state->stack;
	if (state->use_reset_code)
		state->free_ent++;
	state->bits = 9;
	state->section_end_code = (1<<state->bits) - 1;
	state->oldcode = -1;
	for (code = 255; code >= 0; code--) {
		state->prefix[code] = 0;
		state->suffix[code] = code;
	}
	next_code(self);

	return (ARCHIVE_OK);
}